

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_socket.cpp
# Opt level: O0

bool net::TcpSocket::sockConnect(int fd,char *conn_ip,uint16_t conn_port)

{
  int iVar1;
  int flag;
  socklen_t len;
  sockaddr_in conAddr;
  uint16_t conn_port_local;
  char *conn_ip_local;
  int fd_local;
  
  conAddr.sin_zero._2_2_ = conn_port;
  unique0x100000c4 = conn_ip;
  if (conn_ip != (char *)0x0) {
    memset(&flag,0,0x10);
    flag._0_2_ = 2;
    len = inet_addr(stack0xffffffffffffffe8);
    flag._2_2_ = htons(conAddr.sin_zero._2_2_);
    iVar1 = connect(fd,(sockaddr *)&flag,0x10);
    return -1 < iVar1;
  }
  __assert_fail("conn_ip != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/distanceNing[P]benchmarkTool/socket/tcp_socket.cpp"
                ,0x8e,"static bool net::TcpSocket::sockConnect(int, const char *, uint16_t)");
}

Assistant:

bool TcpSocket::sockConnect(int fd, const char* conn_ip, uint16_t conn_port)
{
    assert(conn_ip != NULL);
    sockaddr_in conAddr;
    memset(&conAddr, 0, sizeof(struct sockaddr_in));
    conAddr.sin_family = AF_INET;
    conAddr.sin_addr.s_addr = inet_addr(conn_ip);
    conAddr.sin_port = htons(static_cast<uint16_t>(conn_port));
    socklen_t len = sizeof(conAddr);
    int flag = ::connect(fd, (sockaddr*) &conAddr, len);
    return flag >= 0;
}